

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O3

int ndn_signature_info_tlv_encode(ndn_encoder_t *encoder,ndn_signature_t *signature)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint8_t uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint32_t length;
  uint32_t uVar14;
  bool bVar15;
  
  if (signature->enable_KeyLocator == '\0') {
    uVar4 = 3;
    uVar14 = 0;
  }
  else {
    uVar6 = (ulong)(signature->key_locator_name).components_size;
    if (uVar6 == 0) {
      uVar14 = 2;
      iVar9 = 1;
    }
    else {
      lVar12 = 0;
      uVar4 = 0;
      do {
        uVar5 = *(uint *)((signature->key_locator_name).components[0].value + lVar12 + -4);
        uVar10 = (uint)(signature->key_locator_name).components[0].value[lVar12 + 0x24];
        iVar9 = (0xffff < uVar5) + 3 + (uint)(0xffff < uVar5);
        if (uVar5 < 0xfd) {
          iVar9 = 1;
        }
        uVar4 = uVar4 + uVar10 + iVar9 + (uint)(0xfc < uVar10) * 2 + 1;
        lVar12 = lVar12 + 0x2c;
      } while (uVar6 * 0x2c - lVar12 != 0);
      iVar9 = (0xffff < uVar4) + 3 + (uint)(0xffff < uVar4);
      if (uVar4 < 0xfd) {
        iVar9 = 1;
      }
      uVar14 = uVar4 + iVar9 + 1;
      iVar9 = (uint)(0xffff < uVar14) * 2 + 3;
      if (uVar14 < 0xfd) {
        iVar9 = 1;
      }
    }
    uVar4 = iVar9 + uVar14 + 4;
  }
  bVar15 = signature->enable_ValidityPeriod == '\0';
  uVar5 = uVar4 + 0x2a;
  if (bVar15) {
    uVar5 = uVar4;
  }
  length = 0x26;
  if (bVar15) {
    length = 0;
  }
  uVar4 = uVar5 + 6;
  if (signature->enable_SignatureNonce == '\0') {
    uVar4 = uVar5;
  }
  if (signature->enable_Timestamp != '\0') {
    uVar6 = signature->timestamp;
    iVar9 = 3;
    if ((0xff < uVar6) && (iVar9 = 4, 0xffff < uVar6)) {
      iVar9 = (uint)(uVar6 >> 0x20 != 0) * 4 + 6;
    }
    uVar4 = uVar4 + iVar9;
  }
  if (signature->enable_Seqnum != '\0') {
    uVar6 = signature->seqnum;
    iVar9 = 3;
    if ((0xff < uVar6) && (iVar9 = 4, 0xffff < uVar6)) {
      iVar9 = (uint)(uVar6 >> 0x20 != 0) * 4 + 6;
    }
    uVar4 = uVar4 + iVar9;
  }
  iVar9 = -0xe;
  if (encoder->output_max_size != encoder->offset) {
    uVar8 = '\x16';
    if (signature->is_interest != false) {
      uVar8 = ',';
    }
    encoder->output_value[encoder->offset] = uVar8;
    uVar5 = encoder->offset + 1;
    encoder->offset = uVar5;
    uVar10 = encoder->output_max_size - uVar5;
    iVar7 = 1;
    if (0xfc < uVar4 || encoder->output_max_size == uVar5) {
      if (uVar4 < 0x10000 && 2 < uVar10) {
        iVar7 = 3;
        iVar11 = 2;
        iVar13 = 1;
        uVar8 = 0xfd;
      }
      else {
        if (uVar10 < 5) {
          return -0xe;
        }
        encoder->output_value[uVar5] = 0xfe;
        encoder->output_value[encoder->offset + 1] = (uint8_t)(uVar4 >> 0x18);
        uVar8 = (uint8_t)(uVar4 >> 0x10);
        uVar5 = encoder->offset + 2;
        iVar7 = 5;
        iVar11 = 4;
        iVar13 = 3;
      }
      encoder->output_value[uVar5] = uVar8;
      encoder->output_value[iVar13 + encoder->offset] = (uint8_t)(uVar4 >> 8);
      uVar5 = iVar11 + encoder->offset;
    }
    encoder->output_value[uVar5] = (uint8_t)uVar4;
    uVar4 = iVar7 + encoder->offset;
    encoder->offset = uVar4;
    if (encoder->output_max_size != uVar4) {
      encoder->output_value[uVar4] = '\x1b';
      uVar4 = encoder->offset + 1;
      encoder->offset = uVar4;
      if (encoder->output_max_size != uVar4) {
        encoder->output_value[uVar4] = '\x01';
        uVar1 = encoder->offset;
        uVar4 = uVar1 + 1;
        encoder->offset = uVar4;
        iVar9 = -10;
        if (uVar1 + 2 <= encoder->output_max_size) {
          encoder->output_value[uVar4] = signature->sig_type;
          encoder->offset = encoder->offset + 1;
          if (((signature->enable_KeyLocator == '\0') ||
              (((iVar9 = encoder_append_type(encoder,0x1c), iVar9 == 0 &&
                (iVar9 = encoder_append_length(encoder,uVar14), iVar9 == 0)) &&
               (iVar9 = ndn_name_tlv_encode(encoder,&signature->key_locator_name), iVar9 == 0)))) &&
             ((signature->enable_SignatureNonce == '\0' ||
              (((iVar9 = encoder_append_type(encoder,10), iVar9 == 0 &&
                (iVar9 = encoder_append_length(encoder,4), iVar9 == 0)) &&
               (iVar9 = encoder_append_uint32_value(encoder,signature->signature_nonce), iVar9 == 0)
               ))))) {
            if (signature->enable_Timestamp != '\0') {
              iVar9 = encoder_append_type(encoder,0x28);
              if (iVar9 != 0) {
                return iVar9;
              }
              uVar6 = signature->timestamp;
              uVar14 = 1;
              if ((0xff < uVar6) && (uVar14 = 2, 0xffff < uVar6)) {
                uVar14 = (uint)(uVar6 >> 0x20 != 0) * 4 + 4;
              }
              iVar9 = encoder_append_length(encoder,uVar14);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = encoder_append_uint_value(encoder,signature->timestamp);
              if (iVar9 != 0) {
                return iVar9;
              }
            }
            if (signature->enable_Seqnum != '\0') {
              iVar9 = encoder_append_type(encoder,0x2a);
              if (iVar9 != 0) {
                return iVar9;
              }
              uVar6 = signature->seqnum;
              uVar14 = 1;
              if ((0xff < uVar6) && (uVar14 = 2, 0xffff < uVar6)) {
                uVar14 = (uint)(uVar6 >> 0x20 != 0) * 4 + 4;
              }
              iVar9 = encoder_append_length(encoder,uVar14);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = encoder_append_uint_value(encoder,signature->seqnum);
              if (iVar9 != 0) {
                return iVar9;
              }
            }
            if (signature->enable_ValidityPeriod != '\0') {
              iVar9 = encoder_append_type(encoder,0xfd);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = encoder_append_length(encoder,length);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = encoder_append_type(encoder,0xfe);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = encoder_append_length(encoder,0xf);
              if (iVar9 != 0) {
                return iVar9;
              }
              uVar4 = encoder->offset;
              if ((int)(encoder->output_max_size - uVar4) < 0xf) {
                return -10;
              }
              puVar2 = encoder->output_value;
              uVar3 = *(undefined8 *)(signature->validity_period).not_before;
              *(undefined8 *)(puVar2 + (ulong)uVar4 + 7) =
                   *(undefined8 *)((signature->validity_period).not_before + 7);
              *(undefined8 *)(puVar2 + uVar4) = uVar3;
              encoder->offset = encoder->offset + 0xf;
              iVar9 = encoder_append_type(encoder,0xff);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = encoder_append_length(encoder,0xf);
              if (iVar9 != 0) {
                return iVar9;
              }
              uVar4 = encoder->offset;
              if ((int)(encoder->output_max_size - uVar4) < 0xf) {
                return -10;
              }
              puVar2 = encoder->output_value;
              uVar3 = *(undefined8 *)(signature->validity_period).not_after;
              *(undefined8 *)(puVar2 + (ulong)uVar4 + 7) =
                   *(undefined8 *)((signature->validity_period).not_after + 7);
              *(undefined8 *)(puVar2 + uVar4) = uVar3;
              encoder->offset = encoder->offset + 0xf;
            }
            iVar9 = 0;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int
ndn_signature_info_tlv_encode(ndn_encoder_t* encoder, const ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t info_buffer_size = encoder_probe_block_size(TLV_SignatureType, 1);
  uint32_t key_name_block_size = 0;
  uint32_t validity_period_buffer_size = 0;

  if (signature->enable_KeyLocator > 0) {
    key_name_block_size = ndn_name_probe_block_size(&signature->key_locator_name);
    info_buffer_size += encoder_probe_block_size(TLV_KeyLocator, key_name_block_size);
  }
  if (signature->enable_ValidityPeriod > 0) {
    validity_period_buffer_size = encoder_probe_block_size(TLV_NotBefore, 15);
    validity_period_buffer_size += encoder_probe_block_size(TLV_NotAfter, 15);
    info_buffer_size += encoder_probe_block_size(TLV_ValidityPeriod, validity_period_buffer_size);
  }
  if (signature->enable_SignatureNonce > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Nonce, 4);
  }
  if (signature->enable_Timestamp > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Timestamp,
                                                 encoder_probe_uint_length(signature->timestamp));
  }
  if (signature->enable_Seqnum > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SeqNum,
                                                 encoder_probe_uint_length(signature->seqnum));
  }

  // signatureinfo header
  if (signature->is_interest) {
    ret_val = encoder_append_type(encoder, TLV_InterestSignatureInfo);
  }
  else {
    ret_val = encoder_append_type(encoder, TLV_SignatureInfo);
  }
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, info_buffer_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // signature type
  ret_val = encoder_append_type(encoder, TLV_SignatureType);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, 1);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_byte_value(encoder, signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // key locator
  if (signature->enable_KeyLocator) {
    ret_val = encoder_append_type(encoder, TLV_KeyLocator);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, key_name_block_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_name_tlv_encode(encoder, &signature->key_locator_name);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // signature nonce
  if (signature->enable_SignatureNonce > 0) {
    ret_val = encoder_append_type(encoder, TLV_Nonce);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 4);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint32_value(encoder, signature->signature_nonce);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // timestamp
  if (signature->enable_Timestamp > 0) {
    ret_val = encoder_append_type(encoder, TLV_Timestamp);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(signature->timestamp));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, signature->timestamp);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // timestamp
  if (signature->enable_Seqnum > 0) {
    ret_val = encoder_append_type(encoder, TLV_SeqNum);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(signature->seqnum));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, signature->seqnum);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // validity period
  if (signature->enable_ValidityPeriod) {
    ret_val = encoder_append_type(encoder, TLV_ValidityPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, validity_period_buffer_size);
    if (ret_val != NDN_SUCCESS) return ret_val;

    ret_val = encoder_append_type(encoder, TLV_NotBefore);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(encoder, signature->validity_period.not_before, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;

    ret_val = encoder_append_type(encoder, TLV_NotAfter);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(encoder, signature->validity_period.not_after, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}